

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter.cpp
# Opt level: O0

void __thiscall
Assimp::X3DImporter::MeshGeometry_AddColor
          (X3DImporter *this,aiMesh *pMesh,vector<int,_std::allocator<int>_> *pCoordIdx,
          vector<int,_std::allocator<int>_> *pColorIdx,
          list<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *pColors,bool pColorPerVertex)

{
  float fVar1;
  bool bVar2;
  size_type sVar3;
  DeadlyImportError *pDVar4;
  reference __x;
  size_type sVar5;
  reference piVar6;
  uint *puVar7;
  reference pvVar8;
  reference pvVar9;
  reference __x_00;
  __normal_iterator<aiColor4t<float>_*,_std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>_>
  local_4b8;
  __normal_iterator<aiColor4t<float>_*,_std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>_>
  local_4b0;
  __normal_iterator<const_aiColor4t<float>_*,_std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>_>
  local_4a8;
  const_iterator it_1;
  size_t fi_1;
  string local_490;
  string local_470;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_450;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_430;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_410;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f0;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_3d0;
  undefined1 local_3c2;
  allocator local_3c1;
  string local_3c0;
  ulong local_3a0;
  size_t fi;
  const_iterator colidx_it_1;
  string local_388;
  string local_368;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_348;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_328;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_308;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8;
  ulong local_2c8;
  size_t i;
  string local_2b8;
  string local_298;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  undefined1 local_1f2;
  allocator local_1f1;
  string local_1f0;
  undefined1 local_1ca;
  allocator local_1c9;
  string local_1c8;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_1a8;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_1a0;
  const_iterator coordidx_it;
  const_iterator colidx_it;
  string local_188;
  string local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  _Self local_c8;
  _Self local_c0;
  const_iterator it;
  allocator local_a1;
  string local_a0;
  undefined1 local_80 [8];
  vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> col_arr_copy;
  list<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> col_tgt_list;
  vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> col_tgt_arr;
  bool pColorPerVertex_local;
  list<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *pColors_local;
  vector<int,_std::allocator<int>_> *pColorIdx_local;
  vector<int,_std::allocator<int>_> *pCoordIdx_local;
  aiMesh *pMesh_local;
  X3DImporter *this_local;
  
  std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::vector
            ((vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *)
             &col_tgt_list.super__List_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
              _M_impl._M_node._M_size);
  std::__cxx11::list<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::list
            ((list<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *)
             &col_arr_copy.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::vector
            ((vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *)local_80);
  sVar3 = std::vector<int,_std::allocator<int>_>::size(pCoordIdx);
  if (sVar3 == 0) {
    it._M_node._3_1_ = 1;
    pDVar4 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_a0,"MeshGeometry_AddColor2. pCoordIdx can not be empty.",&local_a1);
    DeadlyImportError::DeadlyImportError(pDVar4,&local_a0);
    it._M_node._3_1_ = 0;
    __cxa_throw(pDVar4,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  sVar3 = std::__cxx11::list<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::size(pColors);
  std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::reserve
            ((vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *)local_80,sVar3);
  local_c0._M_node =
       (_List_node_base *)
       std::__cxx11::list<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::begin(pColors);
  while( true ) {
    local_c8._M_node =
         (_List_node_base *)
         std::__cxx11::list<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::end(pColors);
    bVar2 = std::operator!=(&local_c0,&local_c8);
    if (!bVar2) break;
    __x = std::_List_const_iterator<aiColor4t<float>_>::operator*(&local_c0);
    std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::push_back
              ((vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *)local_80,__x);
    std::_List_const_iterator<aiColor4t<float>_>::operator++(&local_c0);
  }
  if (pColorPerVertex) {
    sVar3 = std::vector<int,_std::allocator<int>_>::size(pColorIdx);
    if (sVar3 == 0) {
      sVar3 = std::__cxx11::list<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::size
                        (pColors);
      if (sVar3 < pMesh->mNumVertices) {
        i._7_1_ = 1;
        pDVar4 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        sVar3 = std::__cxx11::list<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::size
                          (pColors);
        to_string<unsigned_long>(&local_298,sVar3);
        std::operator+(&local_278,"MeshGeometry_AddColor2. Colors count(",&local_298);
        std::operator+(&local_258,&local_278,") can not be less than Vertices count(");
        to_string<unsigned_int>(&local_2b8,pMesh->mNumVertices);
        std::operator+(&local_238,&local_258,&local_2b8);
        std::operator+(&local_218,&local_238,").");
        DeadlyImportError::DeadlyImportError(pDVar4,&local_218);
        i._7_1_ = 0;
        __cxa_throw(pDVar4,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
      }
      std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::resize
                ((vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *)
                 &col_tgt_list.
                  super__List_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
                  _M_node._M_size,(ulong)pMesh->mNumVertices);
      for (local_2c8 = 0; local_2c8 < pMesh->mNumVertices; local_2c8 = local_2c8 + 1) {
        pvVar8 = std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::operator[]
                           ((vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *)local_80
                            ,local_2c8);
        pvVar9 = std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::operator[]
                           ((vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *)
                            &col_tgt_list.
                             super__List_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
                             _M_impl._M_node._M_size,local_2c8);
        fVar1 = pvVar8->g;
        pvVar9->r = pvVar8->r;
        pvVar9->g = fVar1;
        fVar1 = pvVar8->a;
        pvVar9->b = pvVar8->b;
        pvVar9->a = fVar1;
      }
    }
    else {
      sVar3 = std::vector<int,_std::allocator<int>_>::size(pColorIdx);
      sVar5 = std::vector<int,_std::allocator<int>_>::size(pCoordIdx);
      if (sVar3 < sVar5) {
        pDVar4 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        sVar3 = std::vector<int,_std::allocator<int>_>::size(pColorIdx);
        to_string<unsigned_long>(&local_168,sVar3);
        std::operator+(&local_148,"MeshGeometry_AddColor2. Colors indices count(",&local_168);
        std::operator+(&local_128,&local_148,") can not be less than Coords inidces count(");
        sVar3 = std::vector<int,_std::allocator<int>_>::size(pCoordIdx);
        to_string<unsigned_long>(&local_188,sVar3);
        std::operator+(&local_108,&local_128,&local_188);
        std::operator+(&local_e8,&local_108,").");
        DeadlyImportError::DeadlyImportError(pDVar4,&local_e8);
        __cxa_throw(pDVar4,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
      }
      std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::resize
                ((vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *)
                 &col_tgt_list.
                  super__List_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
                  _M_node._M_size,(ulong)pMesh->mNumVertices);
      coordidx_it = std::vector<int,_std::allocator<int>_>::begin(pColorIdx);
      local_1a0._M_current = (int *)std::vector<int,_std::allocator<int>_>::begin(pCoordIdx);
      while( true ) {
        local_1a8._M_current = (int *)std::vector<int,_std::allocator<int>_>::end(pColorIdx);
        bVar2 = __gnu_cxx::operator!=(&coordidx_it,&local_1a8);
        if (!bVar2) break;
        piVar6 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                 ::operator*(&coordidx_it);
        if (*piVar6 != -1) {
          puVar7 = (uint *)__gnu_cxx::
                           __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
                           operator*(&local_1a0);
          if (pMesh->mNumVertices < *puVar7) {
            local_1ca = 1;
            pDVar4 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)&local_1c8,
                       "MeshGeometry_AddColor2. Coordinate idx is out of range.",&local_1c9);
            DeadlyImportError::DeadlyImportError(pDVar4,&local_1c8);
            local_1ca = 0;
            __cxa_throw(pDVar4,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
          }
          puVar7 = (uint *)__gnu_cxx::
                           __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
                           operator*(&coordidx_it);
          if (pMesh->mNumVertices < *puVar7) {
            local_1f2 = 1;
            pDVar4 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)&local_1f0,"MeshGeometry_AddColor2. Color idx is out of range.",
                       &local_1f1);
            DeadlyImportError::DeadlyImportError(pDVar4,&local_1f0);
            local_1f2 = 0;
            __cxa_throw(pDVar4,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
          }
          piVar6 = __gnu_cxx::
                   __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
                   operator*(&coordidx_it);
          pvVar8 = std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::operator[]
                             ((vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *)
                              local_80,(long)*piVar6);
          piVar6 = __gnu_cxx::
                   __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
                   operator*(&local_1a0);
          pvVar9 = std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::operator[]
                             ((vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *)
                              &col_tgt_list.
                               super__List_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>
                               ._M_impl._M_node._M_size,(long)*piVar6);
          fVar1 = pvVar8->g;
          pvVar9->r = pvVar8->r;
          pvVar9->g = fVar1;
          fVar1 = pvVar8->a;
          pvVar9->b = pvVar8->b;
          pvVar9->a = fVar1;
        }
        __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
        operator++(&coordidx_it);
        __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
        operator++(&local_1a0);
      }
    }
  }
  else {
    sVar3 = std::vector<int,_std::allocator<int>_>::size(pColorIdx);
    if (sVar3 == 0) {
      sVar3 = std::__cxx11::list<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::size
                        (pColors);
      if (sVar3 < pMesh->mNumFaces) {
        pDVar4 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        sVar3 = std::__cxx11::list<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::size
                          (pColors);
        to_string<unsigned_long>(&local_470,sVar3);
        std::operator+(&local_450,"MeshGeometry_AddColor2. Colors count(",&local_470);
        std::operator+(&local_430,&local_450,") can not be less than Faces count(");
        to_string<unsigned_int>(&local_490,pMesh->mNumFaces);
        std::operator+(&local_410,&local_430,&local_490);
        std::operator+(&local_3f0,&local_410,").");
        DeadlyImportError::DeadlyImportError(pDVar4,&local_3f0);
        __cxa_throw(pDVar4,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
      }
      std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::resize
                ((vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *)
                 &col_tgt_list.
                  super__List_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
                  _M_node._M_size,(ulong)pMesh->mNumFaces);
      for (it_1._M_current = (aiColor4t<float> *)0x0;
          it_1._M_current < (aiColor4t<float> *)(ulong)pMesh->mNumFaces;
          it_1._M_current = (aiColor4t<float> *)((long)&(it_1._M_current)->r + 1)) {
        pvVar8 = std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::operator[]
                           ((vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *)local_80
                            ,(size_type)it_1._M_current);
        pvVar9 = std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::operator[]
                           ((vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *)
                            &col_tgt_list.
                             super__List_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
                             _M_impl._M_node._M_size,(size_type)it_1._M_current);
        fVar1 = pvVar8->g;
        pvVar9->r = pvVar8->r;
        pvVar9->g = fVar1;
        fVar1 = pvVar8->a;
        pvVar9->b = pvVar8->b;
        pvVar9->a = fVar1;
      }
    }
    else {
      sVar3 = std::vector<int,_std::allocator<int>_>::size(pColorIdx);
      if (sVar3 < pMesh->mNumFaces) {
        colidx_it_1._M_current._7_1_ = 1;
        pDVar4 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        sVar3 = std::vector<int,_std::allocator<int>_>::size(pColorIdx);
        to_string<unsigned_long>(&local_368,sVar3);
        std::operator+(&local_348,"MeshGeometry_AddColor2. Colors indices count(",&local_368);
        std::operator+(&local_328,&local_348,") can not be less than Faces count(");
        to_string<unsigned_int>(&local_388,pMesh->mNumFaces);
        std::operator+(&local_308,&local_328,&local_388);
        std::operator+(&local_2e8,&local_308,").");
        DeadlyImportError::DeadlyImportError(pDVar4,&local_2e8);
        colidx_it_1._M_current._7_1_ = 0;
        __cxa_throw(pDVar4,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
      }
      std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::resize
                ((vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *)
                 &col_tgt_list.
                  super__List_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
                  _M_node._M_size,(ulong)pMesh->mNumFaces);
      fi = (size_t)std::vector<int,_std::allocator<int>_>::begin(pColorIdx);
      for (local_3a0 = 0; local_3a0 < pMesh->mNumFaces; local_3a0 = local_3a0 + 1) {
        puVar7 = (uint *)__gnu_cxx::
                         __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
                         operator*((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                                    *)&fi);
        if (pMesh->mNumFaces < *puVar7) {
          local_3c2 = 1;
          pDVar4 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_3c0,"MeshGeometry_AddColor2. Face idx is out of range.",
                     &local_3c1);
          DeadlyImportError::DeadlyImportError(pDVar4,&local_3c0);
          local_3c2 = 0;
          __cxa_throw(pDVar4,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
        }
        local_3d0 = __gnu_cxx::
                    __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
                    operator++((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                                *)&fi,0);
        piVar6 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                 ::operator*(&local_3d0);
        pvVar8 = std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::operator[]
                           ((vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *)local_80
                            ,(long)*piVar6);
        pvVar9 = std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::operator[]
                           ((vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *)
                            &col_tgt_list.
                             super__List_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
                             _M_impl._M_node._M_size,local_3a0);
        fVar1 = pvVar8->g;
        pvVar9->r = pvVar8->r;
        pvVar9->g = fVar1;
        fVar1 = pvVar8->a;
        pvVar9->b = pvVar8->b;
        pvVar9->a = fVar1;
      }
    }
  }
  local_4b0._M_current =
       (aiColor4t<float> *)
       std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::begin
                 ((vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *)
                  &col_tgt_list.
                   super__List_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
                   _M_node._M_size);
  __gnu_cxx::
  __normal_iterator<aiColor4t<float>const*,std::vector<aiColor4t<float>,std::allocator<aiColor4t<float>>>>
  ::__normal_iterator<aiColor4t<float>*>
            ((__normal_iterator<aiColor4t<float>const*,std::vector<aiColor4t<float>,std::allocator<aiColor4t<float>>>>
              *)&local_4a8,&local_4b0);
  while( true ) {
    local_4b8._M_current =
         (aiColor4t<float> *)
         std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::end
                   ((vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *)
                    &col_tgt_list.
                     super__List_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
                     _M_node._M_size);
    bVar2 = __gnu_cxx::operator!=(&local_4a8,&local_4b8);
    if (!bVar2) break;
    __x_00 = __gnu_cxx::
             __normal_iterator<const_aiColor4t<float>_*,_std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>_>
             ::operator*(&local_4a8);
    std::__cxx11::list<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::push_back
              ((list<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *)
               &col_arr_copy.
                super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,__x_00);
    __gnu_cxx::
    __normal_iterator<const_aiColor4t<float>_*,_std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>_>
    ::operator++(&local_4a8);
  }
  MeshGeometry_AddColor
            (this,pMesh,
             (list<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *)
             &col_arr_copy.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,pColorPerVertex);
  std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::~vector
            ((vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *)local_80);
  std::__cxx11::list<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::~list
            ((list<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *)
             &col_arr_copy.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::~vector
            ((vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *)
             &col_tgt_list.super__List_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
              _M_impl._M_node._M_size);
  return;
}

Assistant:

void X3DImporter::MeshGeometry_AddColor(aiMesh& pMesh, const std::vector<int32_t>& pCoordIdx, const std::vector<int32_t>& pColorIdx,
										const std::list<aiColor4D>& pColors, const bool pColorPerVertex) const
{
    std::vector<aiColor4D> col_tgt_arr;
    std::list<aiColor4D> col_tgt_list;
    std::vector<aiColor4D> col_arr_copy;

    if ( pCoordIdx.size() == 0 )
    {
        throw DeadlyImportError( "MeshGeometry_AddColor2. pCoordIdx can not be empty." );
    }

	// copy list to array because we are need indexed access to colors.
	col_arr_copy.reserve(pColors.size());
    for ( std::list<aiColor4D>::const_iterator it = pColors.begin(); it != pColors.end(); ++it )
    {
        col_arr_copy.push_back( *it );
    }

	if(pColorPerVertex)
	{
		if(pColorIdx.size() > 0)
		{
			// check indices array count.
			if(pColorIdx.size() < pCoordIdx.size())
			{
				throw DeadlyImportError("MeshGeometry_AddColor2. Colors indices count(" + to_string(pColorIdx.size()) +
										") can not be less than Coords inidces count(" + to_string(pCoordIdx.size()) +  ").");
			}
			// create list with colors for every vertex.
			col_tgt_arr.resize(pMesh.mNumVertices);
			for(std::vector<int32_t>::const_iterator colidx_it = pColorIdx.begin(), coordidx_it = pCoordIdx.begin(); colidx_it != pColorIdx.end(); ++colidx_it, ++coordidx_it)
			{
                if ( *colidx_it == ( -1 ) )
                {
                    continue;// skip faces delimiter
                }
                if ( ( unsigned int ) ( *coordidx_it ) > pMesh.mNumVertices )
                {
                    throw DeadlyImportError( "MeshGeometry_AddColor2. Coordinate idx is out of range." );
                }
                if ( ( unsigned int ) *colidx_it > pMesh.mNumVertices )
                {
                    throw DeadlyImportError( "MeshGeometry_AddColor2. Color idx is out of range." );
                }

				col_tgt_arr[*coordidx_it] = col_arr_copy[*colidx_it];
			}
		}// if(pColorIdx.size() > 0)
		else
		{
			// when color indices list is absent use CoordIdx.
			// check indices array count.
			if(pColors.size() < pMesh.mNumVertices)
			{
				throw DeadlyImportError("MeshGeometry_AddColor2. Colors count(" + to_string(pColors.size()) + ") can not be less than Vertices count(" +
										to_string(pMesh.mNumVertices) +  ").");
			}
			// create list with colors for every vertex.
			col_tgt_arr.resize(pMesh.mNumVertices);
            for ( size_t i = 0; i < pMesh.mNumVertices; i++ )
            {
                col_tgt_arr[ i ] = col_arr_copy[ i ];
            }
		}// if(pColorIdx.size() > 0) else
	}// if(pColorPerVertex)
	else
	{
		if(pColorIdx.size() > 0)
		{
			// check indices array count.
			if(pColorIdx.size() < pMesh.mNumFaces)
			{
				throw DeadlyImportError("MeshGeometry_AddColor2. Colors indices count(" + to_string(pColorIdx.size()) +
										") can not be less than Faces count(" + to_string(pMesh.mNumFaces) +  ").");
			}
			// create list with colors for every vertex using faces indices.
			col_tgt_arr.resize(pMesh.mNumFaces);

			std::vector<int32_t>::const_iterator colidx_it = pColorIdx.begin();
			for(size_t fi = 0; fi < pMesh.mNumFaces; fi++)
			{
				if((unsigned int)*colidx_it > pMesh.mNumFaces) throw DeadlyImportError("MeshGeometry_AddColor2. Face idx is out of range.");

				col_tgt_arr[fi] = col_arr_copy[*colidx_it++];
			}
		}// if(pColorIdx.size() > 0)
		else
		{
			// when color indices list is absent use CoordIdx.
			// check indices array count.
			if(pColors.size() < pMesh.mNumFaces)
			{
				throw DeadlyImportError("MeshGeometry_AddColor2. Colors count(" + to_string(pColors.size()) + ") can not be less than Faces count(" +
										to_string(pMesh.mNumFaces) +  ").");
			}
			// create list with colors for every vertex using faces indices.
			col_tgt_arr.resize(pMesh.mNumFaces);
			for(size_t fi = 0; fi < pMesh.mNumFaces; fi++) col_tgt_arr[fi] = col_arr_copy[fi];

		}// if(pColorIdx.size() > 0) else
	}// if(pColorPerVertex) else

	// copy array to list for calling function that add colors.
	for(std::vector<aiColor4D>::const_iterator it = col_tgt_arr.begin(); it != col_tgt_arr.end(); ++it) col_tgt_list.push_back(*it);
	// add prepared colors list to mesh.
	MeshGeometry_AddColor(pMesh, col_tgt_list, pColorPerVertex);
}